

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_cannotLinkUnitsNotAddedToModel_Test::~Units_cannotLinkUnitsNotAddedToModel_Test
          (Units_cannotLinkUnitsNotAddedToModel_Test *this)

{
  Units_cannotLinkUnitsNotAddedToModel_Test *this_local;
  
  ~Units_cannotLinkUnitsNotAddedToModel_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, cannotLinkUnitsNotAddedToModel)
{
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    libcellml::VariablePtr v1 = libcellml::Variable::create();

    u1->setName("a_unit");

    c1->addVariable(v1);
    m->addComponent(c1);

    v1->setUnits(u1);

    m->linkUnits();
    EXPECT_TRUE(m->hasUnlinkedUnits());
}